

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cpp
# Opt level: O1

void __thiscall xercesc_4_0::Match::initialize(Match *this,Match *toCopy)

{
  int n;
  int iVar1;
  RuntimeException *this_00;
  int index;
  
  this->fMemoryManager = toCopy->fMemoryManager;
  n = toCopy->fNoGroups;
  if (-1 < n) {
    setNoGroups(this,n);
    if (n != 0) {
      index = 0;
      do {
        iVar1 = getStartPos(toCopy,index);
        setStartPos(this,index,iVar1);
        iVar1 = getEndPos(toCopy,index);
        setEndPos(this,index,iVar1);
        index = index + 1;
      } while (n != index);
    }
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/Match.hpp"
             ,0x6d,Regex_Result_Not_Set,toCopy->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void Match::initialize(const Match &toCopy){

  //do not copy over value of fPositionSize as it is irrelevant to the 
  //state of the Match

  fMemoryManager = toCopy.fMemoryManager;
  int toCopySize = toCopy.getNoGroups();
  setNoGroups(toCopySize);

  for (int i=0; i<toCopySize; i++){
    setStartPos(i, toCopy.getStartPos(i));
    setEndPos(i, toCopy.getEndPos(i));
  }           

}